

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

ActionMessage * __thiscall
helics::NetworkCommsInterface::generatePortRequest(NetworkCommsInterface *this,int cnt)

{
  string_view string2;
  uint16_t in_DX;
  char *in_RSI;
  ActionMessage *in_RDI;
  __sv_type string1;
  ActionMessage *req;
  ActionMessage *networkAddress;
  undefined1 in_stack_ffffffffffffff98 [16];
  ActionMessage *this_00;
  SmallBuffer *in_stack_ffffffffffffffa8;
  
  this_00 = in_stack_ffffffffffffff98._8_8_;
  networkAddress = in_RDI;
  ActionMessage::ActionMessage(this_00,in_stack_ffffffffffffff98._4_4_);
  networkAddress->messageID = 0x5af;
  gmlc::networking::stripProtocol((string *)networkAddress);
  SmallBuffer::operator=
            (in_stack_ffffffffffffffa8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  networkAddress->counter = in_DX;
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  string1 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  string2._M_str = in_RSI;
  string2._M_len = (size_t)networkAddress;
  ActionMessage::setStringData(in_RDI,(string_view)string1,string2);
  return in_RDI;
}

Assistant:

ActionMessage NetworkCommsInterface::generatePortRequest(int cnt) const
{
    ActionMessage req(CMD_PROTOCOL);
    req.messageID = REQUEST_PORTS;
    req.payload = gmlc::networking::stripProtocol(localTargetAddress);
    req.counter = cnt;
    req.setStringData(brokerName, brokerInitString);
    return req;
}